

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O1

Tensor * __thiscall
cnn::SimpleExecutionEngine::get_value(SimpleExecutionEngine *this,VariableIndex *i)

{
  ComputationGraph *pCVar1;
  
  pCVar1 = (this->super_ExecutionEngine).cg;
  if ((ulong)i->t <
      (ulong)((long)(pCVar1->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar1->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
    if ((this->num_nodes_evaluated).t <= i->t) {
      (*(this->super_ExecutionEngine)._vptr_ExecutionEngine[5])(this);
    }
    return (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start + i->t;
  }
  __assert_fail("i < cg.nodes.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                ,0x1a,"virtual const Tensor &cnn::SimpleExecutionEngine::get_value(VariableIndex)");
}

Assistant:

const Tensor& SimpleExecutionEngine::get_value(VariableIndex i) {
  assert(i < cg.nodes.size());
  if (i >= num_nodes_evaluated) {
    incremental_forward();
  }
  return nfxs[i];
}